

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::Uniform::Uniform
          (Uniform *this,UniformValueGenerator *generator,UniformType *_type,Loc _location,
          DefOccurence _declOccurence,DefOccurence _usageOccurence)

{
  int iVar1;
  ulong uVar2;
  pointer pUVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  Loc _location_00;
  UniformType local_298;
  Uniform local_208;
  
  UniformType::UniformType(&this->type,_type);
  (this->location).super_LayoutSpecifierBase.val = (int)_location.super_LayoutSpecifierBase._0_8_;
  (this->location).super_LayoutSpecifierBase.numSys =
       (int)((ulong)_location.super_LayoutSpecifierBase._0_8_ >> 0x20);
  (this->location).super_LayoutSpecifierBase.occurence.occurence =
       _location.super_LayoutSpecifierBase.occurence.occurence.occurence;
  (this->declOccurence).occurence = _declOccurence.occurence;
  (this->usageOccurence).occurence = _usageOccurence.occurence;
  UniformValue::UniformValue(&this->value,_type,generator);
  (this->childUniforms).
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childUniforms).
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->childUniforms).
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  iVar1 = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->shortName)._M_dataplus._M_p = (pointer)&(this->shortName).field_2;
  (this->shortName)._M_string_length = 0;
  (this->shortName).field_2._M_local_buf[0] = '\0';
  if ((this->type).baseType == 0) {
    uVar5 = (this->location).super_LayoutSpecifierBase.val;
    for (; iVar1 < (this->type).arraySize; iVar1 = iVar1 + 1) {
      pUVar3 = (this->type).childTypes.
               super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = 0;
      for (uVar4 = 0;
          uVar4 < (ulong)(((long)(this->type).childTypes.
                                 super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3) / 0x90);
          uVar4 = uVar4 + 1) {
        UniformType::UniformType(&local_298,(UniformType *)((long)&pUVar3->enumType + lVar6));
        uVar2 = 1999999;
        if (0 < (int)uVar5) {
          uVar2 = (ulong)uVar5;
        }
        _location_00.super_LayoutSpecifierBase.occurence.occurence = (uint)((int)uVar5 < 1) * 5;
        _location_00.super_LayoutSpecifierBase.val = (int)uVar2;
        _location_00.super_LayoutSpecifierBase.numSys = (int)(uVar2 >> 0x20);
        Uniform(&local_208,generator,&local_298,_location_00,
                (DefOccurence)(this->declOccurence).occurence,
                (DefOccurence)(this->usageOccurence).occurence);
        std::
        vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
        ::push_back(&this->childUniforms,&local_208);
        ~Uniform(&local_208);
        UniformType::~UniformType(&local_298);
        pUVar3 = (this->type).childTypes.
                 super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = uVar5 + *(int *)((long)&pUVar3->arraySize + lVar6);
        lVar6 = lVar6 + 0x90;
      }
    }
  }
  return;
}

Assistant:

Uniform(UniformValueGenerator& generator, UniformType _type, Loc _location,
			DefOccurence _declOccurence = DefOccurence::ALL_SH, DefOccurence _usageOccurence = DefOccurence::ALL_SH)
		: type(_type)
		, location(_location)
		, declOccurence(_declOccurence)
		, usageOccurence(_usageOccurence)
		, value(_type, generator)
	{

		if (type.isStruct())
		{
			int currentLocation = location.val;
			for (int arrayElem = 0; arrayElem < type.arraySize; arrayElem++)
			{
				for (size_t child = 0; child < type.childTypes.size(); child++)
				{
					Loc childLocation = Loc::Implicit();
					if (currentLocation > 0)
					{
						childLocation = Loc::C(currentLocation);
					}
					childUniforms.push_back(
						Uniform(generator, type.childTypes[child], childLocation, declOccurence, usageOccurence));
					currentLocation += type.childTypes[child].arraySize;
				}
			}
		}
	}